

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int detect_form(archive_read *a,int *is_form_d)

{
  ssize_t sVar1;
  char cVar2;
  int iVar3;
  byte *b;
  void *pvVar4;
  ssize_t sVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  byte *p;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ulong uStack_70;
  int local_68;
  int local_64;
  ssize_t avail;
  archive_read *local_48;
  ssize_t nl;
  undefined8 local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,&avail);
  if (b == (byte *)0x0) {
    iVar3 = -1;
  }
  else {
    local_64 = 0;
    cVar2 = '\0';
    local_68 = 0;
    lVar13 = avail;
LAB_004a32b7:
    uVar14 = avail;
    if (avail == 0) {
      nl = 0;
      uStack_70 = 0;
    }
    else {
      uStack_70 = get_line_size((char *)b,avail,&nl);
    }
    bVar16 = false;
    while (nl == 0) {
      if ((bVar16) || (uVar14 != uStack_70)) goto LAB_004a36e5;
      uVar15 = (ulong)((int)lVar13 + 0x3ffU & 0xfffffc00);
      pvVar4 = __archive_read_ahead(local_48,uVar15 << (uVar15 < lVar13 + 0xa0U),&avail);
      if (pvVar4 == (void *)0x0) {
        if (avail <= lVar13) {
          uStack_70 = 0;
          goto LAB_004a36e5;
        }
        pvVar4 = __archive_read_ahead(local_48,avail,&avail);
        bVar16 = true;
      }
      else {
        bVar16 = false;
      }
      sVar1 = avail;
      b = (byte *)((long)pvVar4 + (lVar13 - uVar14));
      uVar15 = avail - (lVar13 - uVar14);
      avail = uVar15;
      sVar5 = get_line_size((char *)b,uVar15,&nl);
      uStack_70 = 0;
      if (-1 < sVar5) {
        uStack_70 = uVar14;
      }
      uStack_70 = uStack_70 + sVar5;
      lVar13 = sVar1;
      uVar14 = uVar15;
    }
    if (0 < (long)uStack_70) {
      uVar15 = ~nl;
      if (cVar2 != '\0') {
        iVar3 = bid_keyword_list((char *)b,uStack_70,0,0);
        if (iVar3 < 1) {
          uStack_70 = 1;
          goto LAB_004a36e5;
        }
        b = b + uStack_70;
        if ((b[uVar15] != 0x5c) && (bVar16 = cVar2 == '\x01', cVar2 = '\0', bVar16)) {
          if (1 < local_64) goto LAB_004a36f9;
          local_64 = local_64 + 1;
          cVar2 = '\0';
        }
        avail = uVar14 - uStack_70;
        goto LAB_004a32b7;
      }
      pbVar12 = b + uStack_70;
      pbVar7 = b + uVar15;
      uVar8 = uVar14;
      for (uVar10 = uStack_70; uVar8 = uVar8 - 1, 0 < (long)uVar10; uVar10 = uVar10 - 1) {
        bVar11 = *b;
        if ((bVar11 != 0x20) && (uStack_70 = uVar10, bVar11 != 9)) goto LAB_004a3455;
        b = b + 1;
        uVar14 = uVar14 - 1;
        pbVar7 = pbVar7 + 1;
        avail = uVar8;
      }
      bVar11 = *pbVar12;
      uStack_70 = 0;
      b = pbVar12;
LAB_004a3455:
      if (((bVar11 == 10) || (bVar11 == 0xd)) || (bVar11 == 0x23)) {
        if ((long)uVar10 < 1) {
          uVar10 = 0;
        }
LAB_004a347b:
        b = b + uStack_70;
        avail = uVar14 - uVar10;
        goto LAB_004a32b7;
      }
      if (bVar11 == 0x2f) {
        iVar3 = strncmp((char *)b,"/set",4);
        if (iVar3 == 0) {
          pbVar12 = b + 4;
          lVar6 = uStack_70 - 4;
          iVar3 = 0;
        }
        else {
          iVar3 = strncmp((char *)b,"/unset",6);
          if (iVar3 != 0) goto LAB_004a36e5;
          pbVar12 = b + 6;
          lVar6 = uStack_70 - 6;
          iVar3 = 1;
        }
        iVar3 = bid_keyword_list((char *)pbVar12,lVar6,iVar3,0);
        if (iVar3 < 1) goto LAB_004a36e5;
        cVar2 = (b[uVar15 + uStack_70] == 0x5c) * '\x02';
LAB_004a36bf:
        if ((long)uVar10 < 1) {
          uVar10 = 0;
        }
        goto LAB_004a347b;
      }
      lVar6 = -nl;
      pbVar12 = b + uStack_70;
      uVar8 = 0;
      if (0 < (long)uVar10) {
        uVar8 = uVar10;
      }
      bVar16 = true;
      for (p = b; p < pbVar12; p = p + 1) {
        bVar11 = *p;
        if (bid_entry_safe_char[bVar11] == '\0') {
          if ((0x20 < bVar11) || ((0x100002600U >> ((ulong)(uint)bVar11 & 0x3f) & 1) == 0))
          goto LAB_004a352d;
          break;
        }
        uVar8 = uVar8 - 1;
        bVar16 = false;
      }
      if (!bVar16) {
        iVar3 = 0;
        local_38 = CONCAT71((int7)((ulong)lVar6 >> 8),1);
LAB_004a3612:
        iVar3 = bid_keyword_list((char *)p,uVar8,0,iVar3);
        if (iVar3 < 0) goto LAB_004a36e5;
        bVar11 = (byte)local_38;
        if (local_68 == 1) {
          if ((bVar11 & iVar3 != 0) != 0) {
            local_68 = 1;
            goto LAB_004a36e5;
          }
LAB_004a3693:
          if (bVar11 != 0) {
LAB_004a3698:
            if (pbVar12[uVar15] == 0x5c) {
              cVar2 = '\x01';
              goto LAB_004a36bf;
            }
          }
        }
        else {
          if (local_68 != 0) goto LAB_004a3693;
          local_68 = 1;
          if (bVar11 != 0) {
            local_68 = -(uint)(iVar3 != 0);
            goto LAB_004a3698;
          }
        }
        if (local_64 < 2) {
          local_64 = local_64 + 1;
          cVar2 = '\0';
          goto LAB_004a36bf;
        }
        goto LAB_004a36f9;
      }
LAB_004a352d:
      if ((((pbVar12 + lVar6 + -2 < b) || (pbVar12[lVar6 + -1] != 0x5c)) ||
          ((bVar11 = pbVar12[lVar6 + -2], bVar11 != 9 && (bVar11 != 0x20)))) &&
         ((pbVar12 + lVar6 + -1 < b || (pbVar12[lVar6 + -1] != 0x5c)))) {
        lVar9 = 0;
        uVar8 = 0;
        if (0 < (long)uVar10) {
          uVar8 = uVar10;
        }
        bVar16 = false;
        for (pbVar7 = pbVar7 + uVar8 + ((long)uVar10 >> 0x3f & uVar10); b <= pbVar7;
            pbVar7 = pbVar7 + -1) {
          bVar11 = *pbVar7;
          if ((bVar11 == 9) || (bVar11 == 0x20)) break;
          if (bid_entry_safe_char[bVar11] == '\0') goto LAB_004a36e5;
          if (bVar11 == 0x2f) {
            bVar16 = true;
          }
          lVar9 = lVar9 + 1;
        }
        if ((((int)lVar9 != 0) && (bVar16)) && (pbVar7[1] != 0x2f)) {
          local_38 = 0;
          uVar8 = 0;
          if (0 < (long)uVar10) {
            uVar8 = uVar10;
          }
          uVar8 = (lVar6 + uVar8) - lVar9;
          iVar3 = 1;
          p = b;
          goto LAB_004a3612;
        }
      }
    }
LAB_004a36e5:
    if (local_64 < 3) {
      if (local_64 < 1) {
        return 0;
      }
      if (uStack_70 != 0) {
        return 0;
      }
    }
LAB_004a36f9:
    iVar3 = 0x20;
    if ((is_form_d != (int *)0x0) && (local_68 == 1)) {
      *is_form_d = 1;
    }
  }
  return iVar3;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}